

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O1

void __thiscall IsoWriter::writePartitionDescriptor(IsoWriter *this)

{
  uint8_t *buffer;
  int iVar1;
  char *__src;
  ulong uVar2;
  uint uVar3;
  uint32_t *buff32;
  size_t __n;
  
  buffer = this->m_buffer;
  memset(buffer,0,0x800);
  __src = (this->m_impId)._M_dataplus._M_p;
  uVar2 = (this->m_file).m_pos;
  iVar1 = this->m_tagLocationBaseAddr;
  this->m_buffer[0] = '\x05';
  this->m_buffer[1] = '\0';
  this->m_buffer[2] = '\x03';
  this->m_buffer[3] = '\0';
  this->m_buffer[6] = '\x01';
  this->m_buffer[7] = '\0';
  *(int *)(this->m_buffer + 0xc) = (int)(uVar2 >> 0xb) - iVar1;
  this->m_buffer[0x10] = '\x02';
  this->m_buffer[0x11] = '\0';
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  this->m_buffer[0x14] = '\x01';
  this->m_buffer[0x15] = '\0';
  this->m_buffer[0x16] = '\0';
  this->m_buffer[0x17] = '\0';
  this->m_buffer[0x19] = '+';
  this->m_buffer[0x1a] = 'N';
  this->m_buffer[0x1b] = 'S';
  this->m_buffer[0x1c] = 'R';
  this->m_buffer[0x1c] = 'R';
  this->m_buffer[0x1d] = '0';
  this->m_buffer[0x1e] = '3';
  this->m_buffer[0x1f] = '\0';
  this->m_buffer[0xb8] = '\x01';
  this->m_buffer[0xb9] = '\0';
  this->m_buffer[0xba] = '\0';
  this->m_buffer[0xbb] = '\0';
  iVar1 = this->m_partitionStartAddress;
  *(int *)(this->m_buffer + 0xbc) = iVar1;
  uVar3 = this->m_partitionEndAddress - iVar1;
  __n = (size_t)uVar3;
  *(uint *)(this->m_buffer + 0xc0) = uVar3;
  strcpy((char *)(this->m_buffer + 0xc5),__src);
  strcpy((char *)(this->m_buffer + 0xe4),(this->m_appId)._M_dataplus._M_p);
  anon_unknown.dwarf_1264d9::calcDescriptorCRC(buffer,0x200);
  File::write(&this->m_file,(int)buffer,(void *)0x800,__n);
  return;
}

Assistant:

void IsoWriter::writePartitionDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::Partition, absoluteSectorNum());

    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    const auto buff16 = reinterpret_cast<uint16_t *>(m_buffer);
    buff32[4] = 0x02;                                           // Descriptor Sequence Number
    buff16[10] = 0x01;                                          // partition flags
    buff16[11] = 0x00;                                          // Partition Number
    strcpy(reinterpret_cast<char *>(m_buffer) + 25, "+NSR03");  // Partition Contents
    // skip Partition Header Descriptor (all zero)
    buff32[184 / 4] = 0x01;                                             // Access Type
    buff32[188 / 4] = m_partitionStartAddress;                          // Partition Starting Location (576K address )
    buff32[192 / 4] = m_partitionEndAddress - m_partitionStartAddress;  // Partition Length field

    strcpy(reinterpret_cast<char *>(m_buffer) + 0xc5, m_impId.c_str());  // ImplementationID
    strcpy(reinterpret_cast<char *>(m_buffer) + 0xe4, m_appId.c_str());  // ImplementationUse

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}